

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O2

aom_codec_err_t ctrl_set_reference(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  int *piVar2;
  aom_codec_err_t aVar3;
  undefined8 *puVar4;
  YV12_BUFFER_CONFIG sd;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar4 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    puVar4 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = puVar4 + 1;
  }
  piVar2 = (int *)*puVar4;
  if (piVar2 == (int *)0x0) {
    aVar3 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    image2yuvconfig((aom_image_t *)(piVar2 + 2),&sd);
    av1_set_reference_enc(ctx->ppi->cpi,*piVar2,&sd);
    aVar3 = AOM_CODEC_OK;
  }
  return aVar3;
}

Assistant:

static aom_codec_err_t ctrl_set_reference(aom_codec_alg_priv_t *ctx,
                                          va_list args) {
  av1_ref_frame_t *const data = va_arg(args, av1_ref_frame_t *);

  if (data) {
    av1_ref_frame_t *const frame = data;
    YV12_BUFFER_CONFIG sd;
    AVxWorker *const worker = ctx->frame_worker;
    FrameWorkerData *const frame_worker_data = (FrameWorkerData *)worker->data1;
    image2yuvconfig(&frame->img, &sd);
    return av1_set_reference_dec(&frame_worker_data->pbi->common, frame->idx,
                                 frame->use_external_ref, &sd);
  } else {
    return AOM_CODEC_INVALID_PARAM;
  }
}